

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O1

void __thiscall dmlc::JSONWriter::EndArray(JSONWriter *this)

{
  ulong uVar1;
  uint uVar2;
  pointer puVar3;
  _Bit_type *p_Var4;
  unsigned_long uVar5;
  ostream *poVar6;
  ulong uVar7;
  LogCheckError _check_err;
  LogCheckError local_1a8;
  uint local_19c;
  LogMessageFatal local_198;
  
  local_198._0_8_ =
       (ulong)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
       ((long)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
       (long)(this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
  local_19c = 0;
  LogCheck_NE<unsigned_long,unsigned_int>((dmlc *)&local_1a8,(unsigned_long *)&local_198,&local_19c)
  ;
  if (local_1a8.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x353);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"scope_multi_line_.size() != 0U",0x1e);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_198,((local_1a8.str)->_M_dataplus)._M_p,
                        (local_1a8.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  LogCheckError::~LogCheckError(&local_1a8);
  local_198._0_8_ =
       (long)(this->scope_counter_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->scope_counter_).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  local_19c = 0;
  LogCheck_NE<unsigned_long,unsigned_int>((dmlc *)&local_1a8,(unsigned_long *)&local_198,&local_19c)
  ;
  if (local_1a8.str != (string *)0x0) {
    LogMessageFatal::LogMessageFatal
              (&local_198,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/liueo[P]TVM-deploy/tvm/3rdparty/dmlc-core/include/dmlc/json.h"
               ,0x354);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"Check failed: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_198,"scope_counter_.size() != 0U",0x1b);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_198,((local_1a8.str)->_M_dataplus)._M_p,
                        (local_1a8.str)->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    LogMessageFatal::~LogMessageFatal(&local_198);
  }
  LogCheckError::~LogCheckError(&local_1a8);
  puVar3 = (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar2 = (this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  uVar1 = (ulong)uVar2 - 1;
  uVar7 = (ulong)uVar2 + 0x3e;
  if (-1 < (long)uVar1) {
    uVar7 = uVar1;
  }
  p_Var4 = (this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar7 = p_Var4[((long)uVar7 >> 6) +
                 ((ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) - 1)];
  uVar5 = puVar3[-1];
  (this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
  super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = uVar2 - 1;
  if (uVar2 == 0) {
    (this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0x3f;
    (this->scope_multi_line_).super__Bvector_base<std::allocator<bool>_>._M_impl.
    super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = p_Var4 + -1;
  }
  (this->scope_counter_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar3 + -1;
  if (((1L << ((byte)uVar1 & 0x3f) & uVar7) != 0) && (uVar5 != 0)) {
    WriteSeperator(this);
  }
  local_198.log_stream_ = (ostringstream)0x5d;
  std::__ostream_insert<char,std::char_traits<char>>(this->os_,(char *)&local_198,1);
  return;
}

Assistant:

inline void JSONWriter::EndArray() {
  CHECK_NE(scope_multi_line_.size(), 0U);
  CHECK_NE(scope_counter_.size(), 0U);
  bool newline = scope_multi_line_.back();
  size_t nelem = scope_counter_.back();
  scope_multi_line_.pop_back();
  scope_counter_.pop_back();
  if (newline && nelem != 0) WriteSeperator();
  Extend(os_, ']');
}